

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::Entity(Entity *this,int Hit)

{
  this->_vptr_Entity = (_func_int **)&PTR___cxa_pure_virtual_00117a58;
  std::__cxx11::string::string((string *)&this->name,(string *)&this->name);
  this->durability = Hit;
  return;
}

Assistant:

Entity::Entity(int Hit) : name(name), durability(Hit) {}